

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
          *other)

{
  ulong nbRows;
  ulong nbCols;
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  
  nbRows = *(ulong *)(*(long *)other + 8);
  nbCols = *(ulong *)(*(long *)other + 0x10);
  bVar4 = nbCols == 0 || nbRows == 0;
  if ((bVar4) ||
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar3 = SUB168(auVar1 % SEXT816((long)nbCols),0),
     (long)nbRows <= SUB168(auVar1 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | nbRows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar4) ||
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar3 = SUB168(auVar1 % SEXT816((long)nbCols),0),
       (long)nbRows <= SUB168(auVar1 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * nbRows,nbRows,nbCols);
      TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u>>::
      evalToLazy<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                  *)other,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
      return (Matrix<double,__1,__1,_0,__1,__1> *)this;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8,bVar4,uVar3);
  *puVar2 = operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE Derived& operator=(const EigenBase<OtherDerived> &other)
    {
      _resize_to_match(other);
      Base::operator=(other.derived());
      return this->derived();
    }